

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooled_alloc.c
# Opt level: O1

void * pool_alloc(pool_alloc_t *p)

{
  size_t sVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  pool_t *ppVar4;
  void *pvVar5;
  undefined8 *puVar6;
  ulong uVar7;
  pool_t *ppVar8;
  
  puVar6 = (undefined8 *)p->free;
  if (puVar6 == (undefined8 *)0x0) {
    sVar1 = p->npools;
    if (sVar1 != 0) {
      ppVar4 = p->pools;
      sVar2 = ppVar4[sVar1 - 1].used;
      uVar7 = p->dsize + sVar2;
      if (uVar7 < 0x100000) {
        pvVar5 = ppVar4[sVar1 - 1].pool;
        ppVar4[sVar1 - 1].used = uVar7;
        return (void *)(sVar2 + (long)pvVar5);
      }
    }
    uVar7 = p->dsize;
    ppVar4 = (pool_t *)realloc(p->pools,sVar1 * 0x10 + 0x10);
    if (ppVar4 == (pool_t *)0x0) {
      ppVar8 = (pool_t *)0x0;
    }
    else {
      ppVar8 = (pool_t *)0x0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar7;
      p->pools = ppVar4;
      sVar1 = p->npools;
      pvVar5 = malloc(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100000)) / auVar3,0) * p->dsize);
      ppVar4[sVar1].pool = pvVar5;
      if (pvVar5 != (void *)0x0) {
        ppVar8 = ppVar4 + sVar1;
        ppVar8->used = 0;
        p->npools = sVar1 + 1;
      }
    }
    if (ppVar8 == (pool_t *)0x0) {
      puVar6 = (undefined8 *)0x0;
    }
    else {
      ppVar8->used = p->dsize;
      puVar6 = (undefined8 *)ppVar8->pool;
    }
  }
  else {
    p->free = (void *)*puVar6;
  }
  return puVar6;
}

Assistant:

void *pool_alloc(pool_alloc_t *p) {
    pool_t *pool;
    void *ret;

    /* Look on free list */
    if (NULL != p->free) {
        ret = p->free;
	p->free = *((void **)p->free);
	return ret;
    }

    /* Look for space in the last pool */
    if (p->npools) {
        pool = &p->pools[p->npools - 1];
        if (pool->used + p->dsize < PSIZE) {
	    ret = ((char *) pool->pool) + pool->used;
	    pool->used += p->dsize;
	    return ret;
	}
    }

    /* Need a new pool */
    pool = new_pool(p);
    if (NULL == pool) return NULL;

    pool->used = p->dsize;
    return pool->pool;
}